

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

BigInteger * __thiscall BigInteger::_divide_long(BigInteger *this,BigInteger *a)

{
  compare_t cVar1;
  iterator this_00;
  long in_RDX;
  long in_RSI;
  BigInteger *in_RDI;
  int m;
  int r;
  int l;
  int shift;
  BigInteger ans;
  BigInteger *in_stack_fffffffffffffe68;
  BigInteger *in_stack_fffffffffffffe70;
  BigInteger *pBVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe78;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe80;
  iterator in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  compare_t in_stack_fffffffffffffe94;
  BigInteger *in_stack_fffffffffffffe98;
  iterator in_stack_fffffffffffffea0;
  BigInteger local_110;
  uint local_f0 [9];
  int local_cc;
  int local_84;
  int local_80;
  int local_7c;
  uint *local_78;
  uint *local_70;
  uint *local_60;
  undefined4 local_54;
  uint *local_50;
  int local_40;
  undefined4 local_3c;
  BigInteger local_38;
  
  *(undefined1 *)(in_RDX + 0x18) = 0;
  *(undefined1 *)(in_RSI + 0x18) = 0;
  pBVar2 = in_RDI;
  BigInteger(in_stack_fffffffffffffe70);
  cVar1 = _compareAbs(in_stack_fffffffffffffe98,
                      (BigInteger *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  if (cVar1 < CMP_EQUAL) {
    BigInteger((BigInteger *)in_stack_fffffffffffffe80._M_current,
               (longlong)in_stack_fffffffffffffe78._M_current);
  }
  else {
    local_40 = 0;
    while (cVar1 = _compareAbs(in_stack_fffffffffffffe98,
                               (BigInteger *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)),
          CMP_LESS < cVar1) {
      local_50 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   (&in_stack_fffffffffffffe68->digits);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_fffffffffffffe70,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_fffffffffffffe68);
      local_54 = 0;
      in_stack_fffffffffffffea0 =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                     (&in_stack_fffffffffffffe70->digits,in_stack_fffffffffffffe78._M_current,
                      (value_type *)in_stack_fffffffffffffe68);
      local_40 = local_40 + 1;
      local_60 = in_stack_fffffffffffffea0._M_current;
    }
    local_70 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 (&in_stack_fffffffffffffe68->digits);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffe70,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffe68);
    this_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                        (in_stack_fffffffffffffe80._M_current,in_stack_fffffffffffffe88._M_current);
    local_78 = this_00._M_current;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffffea0._M_current,(size_type)this_00._M_current);
    for (; local_40 != 0; local_40 = local_40 + -1) {
      local_7c = 0;
      local_80 = 1000000000;
      while (local_7c + 1 < local_80) {
        local_84 = (local_7c + local_80) / 2;
        BigInteger((BigInteger *)in_stack_fffffffffffffe80._M_current,
                   (longlong)in_stack_fffffffffffffe78._M_current);
        ::operator*(pBVar2,(BigInteger *)in_stack_fffffffffffffea0._M_current);
        in_stack_fffffffffffffe94 =
             _compareAbs((BigInteger *)this_00._M_current,
                         (BigInteger *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                        );
        ~BigInteger((BigInteger *)0x14dcca);
        ~BigInteger((BigInteger *)0x14dcd7);
        if (in_stack_fffffffffffffe94 < CMP_EQUAL) {
          local_80 = local_84;
        }
        else {
          local_7c = local_84;
        }
      }
      local_cc = local_7c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&in_stack_fffffffffffffe70->digits,(value_type *)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe80._M_current = (uint *)&local_110;
      BigInteger((BigInteger *)in_stack_fffffffffffffe80._M_current,
                 (longlong)in_stack_fffffffffffffe78._M_current);
      in_stack_fffffffffffffe78._M_current = local_f0;
      ::operator*(pBVar2,(BigInteger *)in_stack_fffffffffffffea0._M_current);
      operator-=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      ~BigInteger((BigInteger *)0x14dd77);
      ~BigInteger((BigInteger *)0x14dd81);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                (&in_stack_fffffffffffffe68->digits);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_fffffffffffffe70,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe88 =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                     (in_stack_fffffffffffffe80._M_current,in_stack_fffffffffffffe88._M_current);
    }
    pBVar2 = &local_38;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
              (&in_stack_fffffffffffffe68->digits);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              (&in_stack_fffffffffffffe68->digits);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    normalize(pBVar2);
    BigInteger(pBVar2,in_stack_fffffffffffffe68);
  }
  local_3c = 1;
  ~BigInteger((BigInteger *)0x14de49);
  return in_RDI;
}

Assistant:

const BigInteger BigInteger::_divide_long(BigInteger a) noexcept
{
    negative = a.negative = false;
    BigInteger ans;
    if(_compareAbs(a) < 0)
        return 0;
    int shift = 0;
    while(_compareAbs(a) >= 0)
    {
        a.digits.insert(a.digits.begin(), 0);
        ++shift;
    }
    a.digits.erase(a.digits.begin());
    ans.digits.reserve(shift);
    for(; shift; --shift)
    {
        int l = 0, r = BLOCK_MOD;
        while(l + 1 < r)
        {
            int m = (l + r) / 2;
            if(_compareAbs(a * m) < 0)
                r = m;
            else
                l = m;
        }
        ans.digits.push_back(l);
        *this -= a * l;
        a.digits.erase(a.digits.begin());
    }
    std::reverse(ans.digits.begin(), ans.digits.end());
    ans.normalize();
    return ans;
}